

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shape.cpp
# Opt level: O2

double __thiscall phyr::Shape::pdf(Shape *this,Interaction *ref,Vector3f *wi)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double extraout_XMM0_Qa;
  double tHit;
  Vector3<double> local_238;
  Ray ray;
  SurfaceInteraction isectLight;
  
  Interaction::emitRay(&ray,ref,wi);
  memset(&isectLight,0,0x1b0);
  iVar1 = (*this->_vptr_Shape[5])(this,&ray,&tHit,&isectLight,1);
  dVar3 = 0.0;
  if ((char)iVar1 != '\0') {
    dVar2 = distanceSquared<double>(&ref->p,(Point3<double> *)&isectLight);
    local_238.z = -wi->z;
    local_238.x = -wi->x;
    local_238.y = -wi->y;
    dVar3 = absDot<double>(&isectLight.super_Interaction.n,&local_238);
    (*this->_vptr_Shape[4])(this);
    dVar2 = dVar2 / (extraout_XMM0_Qa * dVar3);
    dVar3 = 0.0;
    if (ABS(dVar2) != INFINITY) {
      dVar3 = dVar2;
    }
  }
  return dVar3;
}

Assistant:

Real Shape::pdf(const Interaction& ref, const Vector3f& wi) const {
    // Intersect sample ray with area light geometry
    Ray ray = ref.emitRay(wi);
    Real tHit;
    SurfaceInteraction isectLight;

    // Ignore any alpha textures used for trimming the shape when performing
    // this intersection.
    if (!intersectRay(ray, &tHit, &isectLight)) return 0;

    // Convert light sample weight to solid angle measure
    Real pdf = distanceSquared(ref.p, isectLight.p) / (absDot(isectLight.n, -wi) * surfaceArea());
    if (std::isinf(pdf)) pdf = 0.f;
    return pdf;
}